

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)

{
  byte *pbVar1;
  ImVector<ImGuiDockRequest> *this;
  byte bVar2;
  ImGuiID IVar3;
  ImGuiContext *ctx;
  byte bVar4;
  ImGuiDockNode *pIVar5;
  ImGuiDockRequest *pIVar6;
  ImGuiDockNode **ppIVar7;
  ImGuiWindowSettings *p;
  int n_2;
  int n;
  int iVar8;
  int n_1;
  int i;
  ImVector<ImGuiStorage::ImGuiStoragePair> *this_00;
  ImVector<ImGuiDockNode_*> nodes_to_remove;
  ImGuiDockNode *local_68;
  ImGuiDockNode *node;
  ulong local_48;
  ulong local_40;
  ImVector<ImGuiStorage::ImGuiStoragePair> *local_38;
  
  ctx = GImGui;
  this_00 = (ImVector<ImGuiStorage::ImGuiStoragePair> *)&GImGui->DockContext;
  iVar8 = 0;
  if (root_id == 0) {
    local_40 = 0;
    local_68 = (ImGuiDockNode *)0x0;
    local_48 = 0;
  }
  else {
    local_68 = (ImGuiDockNode *)ImGuiStorage::GetVoidPtr((ImGuiStorage *)this_00,root_id);
    if (local_68 == (ImGuiDockNode *)0x0) {
      return;
    }
    local_40 = (ulong)(*(ushort *)&local_68->field_0xb8 & 7);
    local_48 = (ulong)(*(ushort *)&local_68->field_0xb8 & 0x38);
  }
  nodes_to_remove.Size = 0;
  nodes_to_remove.Capacity = 0;
  nodes_to_remove.Data = (ImGuiDockNode **)0x0;
  this = &(ctx->DockContext).Requests;
  bVar4 = 0;
  local_38 = this_00;
  for (; iVar8 < this_00->Size; iVar8 = iVar8 + 1) {
    pIVar5 = (ImGuiDockNode *)ImVector<ImGuiStorage::ImGuiStoragePair>::operator[](this_00,iVar8);
    node = *(ImGuiDockNode **)&pIVar5->LocalFlags;
    if ((node != (ImGuiDockNode *)0x0) &&
       ((root_id == 0 ||
        ((node->ID != root_id && (pIVar5 = DockNodeGetRootNode(pIVar5), pIVar5->ID == root_id))))))
    {
      pIVar5 = node;
      bVar2 = *(byte *)((long)&node->LocalFlags + 1);
      if (root_id != 0) {
        for (i = 0; this_00 = local_38, i < this->Size; i = i + 1) {
          pIVar6 = ImVector<ImGuiDockRequest>::operator[](this,i);
          if (pIVar6->DockTargetNode == pIVar5) {
            pIVar6 = ImVector<ImGuiDockRequest>::operator[](this,i);
            pIVar6->Type = ImGuiDockRequestType_None;
          }
        }
        if (root_id != 0) {
          DockNodeMoveWindows(local_68,node);
        }
      }
      ImVector<ImGuiDockNode_*>::push_back(&nodes_to_remove,&node);
      bVar4 = bVar4 | (bVar2 & 8) >> 3;
    }
  }
  if (root_id != 0) {
    *(ushort *)&local_68->field_0xb8 =
         (ushort)local_48 | (ushort)local_40 | (ushort)*(undefined4 *)&local_68->field_0xb8 & 0xffc0
    ;
  }
  p = (ImGuiWindowSettings *)(ctx->SettingsWindows).Buf.Data;
  if (p != (ImGuiWindowSettings *)0x0) {
    p = (ImGuiWindowSettings *)&p->Pos;
  }
  do {
    if (p == (ImGuiWindowSettings *)0x0) {
      if (1 < (long)nodes_to_remove.Size) {
        qsort(nodes_to_remove.Data,(long)nodes_to_remove.Size,8,DockNodeComparerDepthMostFirst);
      }
      for (iVar8 = 0; iVar8 < nodes_to_remove.Size; iVar8 = iVar8 + 1) {
        ppIVar7 = ImVector<ImGuiDockNode_*>::operator[](&nodes_to_remove,iVar8);
        DockContextRemoveNode(ctx,*ppIVar7,false);
      }
      if (root_id == 0) {
        ImVector<ImGuiStorage::ImGuiStoragePair>::clear(local_38);
        ImVector<ImGuiDockRequest>::clear(this);
      }
      else if (bVar4 != 0) {
        pbVar1 = (byte *)((long)&local_68->LocalFlags + 1);
        *pbVar1 = *pbVar1 | 8;
        local_68->CentralNode = local_68;
      }
      ImVector<ImGuiDockNode_*>::~ImVector(&nodes_to_remove);
      return;
    }
    IVar3 = p->DockId;
    if (IVar3 != 0) {
      iVar8 = 0;
      do {
        if (nodes_to_remove.Size <= iVar8) goto LAB_0013200d;
        ppIVar7 = ImVector<ImGuiDockNode_*>::operator[](&nodes_to_remove,iVar8);
        iVar8 = iVar8 + 1;
      } while ((*ppIVar7)->ID != IVar3);
      p->DockId = root_id;
    }
LAB_0013200d:
    p = ImChunkStream<ImGuiWindowSettings>::next_chunk(&ctx->SettingsWindows,p);
  } while( true );
}

Assistant:

void ImGui::DockBuilderRemoveNodeChildNodes(ImGuiID root_id)
{
    ImGuiContext* ctx = GImGui;
    ImGuiDockContext* dc  = &ctx->DockContext;

    ImGuiDockNode* root_node = root_id ? DockContextFindNodeByID(ctx, root_id) : NULL;
    if (root_id && root_node == NULL)
        return;
    bool has_central_node = false;

    ImGuiDataAuthority backup_root_node_authority_for_pos = root_node ? root_node->AuthorityForPos : ImGuiDataAuthority_Auto;
    ImGuiDataAuthority backup_root_node_authority_for_size = root_node ? root_node->AuthorityForSize : ImGuiDataAuthority_Auto;

    // Process active windows
    ImVector<ImGuiDockNode*> nodes_to_remove;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
        {
            bool want_removal = (root_id == 0) || (node->ID != root_id && DockNodeGetRootNode(node)->ID == root_id);
            if (want_removal)
            {
                if (node->IsCentralNode())
                    has_central_node = true;
                if (root_id != 0)
                    DockContextQueueNotifyRemovedNode(ctx, node);
                if (root_node)
                    DockNodeMoveWindows(root_node, node);
                nodes_to_remove.push_back(node);
            }
        }

    // DockNodeMoveWindows->DockNodeAddWindow will normally set those when reaching two windows (which is only adequate during interactive merge)
    // Make sure we don't lose our current pos/size. (FIXME-DOCK: Consider tidying up that code in DockNodeAddWindow instead)
    if (root_node)
    {
        root_node->AuthorityForPos = backup_root_node_authority_for_pos;
        root_node->AuthorityForSize = backup_root_node_authority_for_size;
    }

    // Apply to settings
    for (ImGuiWindowSettings* settings = ctx->SettingsWindows.begin(); settings != NULL; settings = ctx->SettingsWindows.next_chunk(settings))
        if (ImGuiID window_settings_dock_id = settings->DockId)
            for (int n = 0; n < nodes_to_remove.Size; n++)
                if (nodes_to_remove[n]->ID == window_settings_dock_id)
                {
                    settings->DockId = root_id;
                    break;
                }

    // Not really efficient, but easier to destroy a whole hierarchy considering DockContextRemoveNode is attempting to merge nodes
    if (nodes_to_remove.Size > 1)
        ImQsort(nodes_to_remove.Data, nodes_to_remove.Size, sizeof(ImGuiDockNode*), DockNodeComparerDepthMostFirst);
    for (int n = 0; n < nodes_to_remove.Size; n++)
        DockContextRemoveNode(ctx, nodes_to_remove[n], false);

    if (root_id == 0)
    {
        dc->Nodes.Clear();
        dc->Requests.clear();
    }
    else if (has_central_node)
    {
        root_node->LocalFlags |= ImGuiDockNodeFlags_CentralNode;
        root_node->CentralNode = root_node;
    }
}